

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day25.cpp
# Opt level: O2

void day25(input_t input)

{
  undefined4 uVar1;
  char cVar2;
  ushort uVar3;
  ushort uVar4;
  uint uVar5;
  undefined1 auVar6 [32];
  bool bVar7;
  ushort uVar8;
  pointer pcVar9;
  uint16_t uVar10;
  uint16_t uVar11;
  pointer pSVar12;
  pointer pSVar13;
  pointer pSVar14;
  byte bVar15;
  size_t __n;
  size_t __n_00;
  ulong uVar16;
  uint uVar17;
  pointer pSVar18;
  pointer pSVar19;
  uint uVar20;
  long lVar21;
  pointer this;
  ulong uVar22;
  pointer pSVar23;
  _Vector_base<(anonymous_namespace)::DisjointSet::Set,_std::allocator<(anonymous_namespace)::DisjointSet::Set>_>
  *this_00;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  DisjointSet S;
  vector<signed_char,_boost::alignment::aligned_allocator<signed_char,_32UL>_> V;
  
  V.super__Vector_base<signed_char,_boost::alignment::aligned_allocator<signed_char,_32UL>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  V.super__Vector_base<signed_char,_boost::alignment::aligned_allocator<signed_char,_32UL>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  V.super__Vector_base<signed_char,_boost::alignment::aligned_allocator<signed_char,_32UL>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<signed_char,_boost::alignment::aligned_allocator<signed_char,_32UL>_>::reserve
            (&V,0x2000);
  bVar7 = false;
  for (lVar21 = 0; input.len != lVar21; lVar21 = lVar21 + 1) {
    cVar2 = input.s[lVar21];
    if ((byte)(cVar2 - 0x30U) < 10) {
      bVar15 = cVar2 - 0x30U;
      if (bVar7) {
        bVar15 = 0x30 - cVar2;
      }
      S.S.
      super__Vector_base<(anonymous_namespace)::DisjointSet::Set,_std::allocator<(anonymous_namespace)::DisjointSet::Set>_>
      ._M_impl.super__Vector_impl_data._M_start._0_1_ = bVar15;
      std::vector<signed_char,_boost::alignment::aligned_allocator<signed_char,_32UL>_>::
      emplace_back<signed_char>(&V,(char *)&S);
      bVar7 = false;
    }
    else if (cVar2 == '-') {
      bVar7 = true;
    }
  }
  uVar22 = (long)V.
                 super__Vector_base<signed_char,_boost::alignment::aligned_allocator<signed_char,_32UL>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)V.
                 super__Vector_base<signed_char,_boost::alignment::aligned_allocator<signed_char,_32UL>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  pSVar19 = (pointer)(uVar22 + 0x1f & 0xffffffffffffffe0);
  std::vector<signed_char,_boost::alignment::aligned_allocator<signed_char,_32UL>_>::resize
            (&V,(size_type)pSVar19);
  S.S.
  super__Vector_base<(anonymous_namespace)::DisjointSet::Set,_std::allocator<(anonymous_namespace)::DisjointSet::Set>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar22 = uVar22 >> 2;
  S.S.
  super__Vector_base<(anonymous_namespace)::DisjointSet::Set,_std::allocator<(anonymous_namespace)::DisjointSet::Set>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  S.S.
  super__Vector_base<(anonymous_namespace)::DisjointSet::Set,_std::allocator<(anonymous_namespace)::DisjointSet::Set>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar10 = (uint16_t)uVar22;
  S.trees = uVar10;
  if (uVar10 == 0) {
    pSVar12 = (pointer)0x0;
  }
  else {
    pSVar12 = std::
              _Vector_base<(anonymous_namespace)::DisjointSet::Set,_std::allocator<(anonymous_namespace)::DisjointSet::Set>_>
              ::_M_allocate((_Vector_base<(anonymous_namespace)::DisjointSet::Set,_std::allocator<(anonymous_namespace)::DisjointSet::Set>_>
                             *)(uVar22 & 0xffff),(size_t)pSVar19);
    pSVar19 = (pointer)0x0;
    std::
    _Vector_base<(anonymous_namespace)::DisjointSet::Set,_std::allocator<(anonymous_namespace)::DisjointSet::Set>_>
    ::_M_deallocate((_Vector_base<(anonymous_namespace)::DisjointSet::Set,_std::allocator<(anonymous_namespace)::DisjointSet::Set>_>
                     *)0x0,(pointer)0x0,__n);
    S.S.
    super__Vector_base<(anonymous_namespace)::DisjointSet::Set,_std::allocator<(anonymous_namespace)::DisjointSet::Set>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pSVar12 + (long)(uVar22 & 0xffff);
    S.S.
    super__Vector_base<(anonymous_namespace)::DisjointSet::Set,_std::allocator<(anonymous_namespace)::DisjointSet::Set>_>
    ._M_impl.super__Vector_impl_data._M_finish = pSVar12;
    S.S.
    super__Vector_base<(anonymous_namespace)::DisjointSet::Set,_std::allocator<(anonymous_namespace)::DisjointSet::Set>_>
    ._M_impl.super__Vector_impl_data._M_start = pSVar12;
  }
  pSVar18 = S.S.
            super__Vector_base<(anonymous_namespace)::DisjointSet::Set,_std::allocator<(anonymous_namespace)::DisjointSet::Set>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
  this = pSVar12;
  for (uVar11 = 0; pSVar14 = (pointer)0x1,
      pSVar23 = S.S.
                super__Vector_base<(anonymous_namespace)::DisjointSet::Set,_std::allocator<(anonymous_namespace)::DisjointSet::Set>_>
                ._M_impl.super__Vector_impl_data._M_start, uVar11 != uVar10; uVar11 = uVar11 + 1) {
    if (pSVar12 == pSVar18) {
      lVar21 = (long)pSVar18 - (long)this;
      if (lVar21 == 0x7ffffffffffffffc) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      pSVar23 = (pointer)(lVar21 >> 2);
      pSVar12 = pSVar23;
      if (pSVar18 == this) {
        pSVar12 = pSVar14;
      }
      this_00 = (_Vector_base<(anonymous_namespace)::DisjointSet::Set,_std::allocator<(anonymous_namespace)::DisjointSet::Set>_>
                 *)((long)&pSVar23->parent + (long)&pSVar12->parent);
      if ((_Vector_base<(anonymous_namespace)::DisjointSet::Set,_std::allocator<(anonymous_namespace)::DisjointSet::Set>_>
           *)0x1ffffffffffffffe < this_00) {
        this_00 = (_Vector_base<(anonymous_namespace)::DisjointSet::Set,_std::allocator<(anonymous_namespace)::DisjointSet::Set>_>
                   *)0x1fffffffffffffff;
      }
      if (CARRY8((ulong)pSVar12,(ulong)pSVar23)) {
        this_00 = (_Vector_base<(anonymous_namespace)::DisjointSet::Set,_std::allocator<(anonymous_namespace)::DisjointSet::Set>_>
                   *)0x1fffffffffffffff;
      }
      pSVar13 = std::
                _Vector_base<(anonymous_namespace)::DisjointSet::Set,_std::allocator<(anonymous_namespace)::DisjointSet::Set>_>
                ::_M_allocate(this_00,(size_t)pSVar19);
      *(uint16_t *)((long)pSVar13 + lVar21) = uVar11;
      *(undefined2 *)((long)pSVar13 + lVar21 + 2) = 0;
      pSVar19 = pSVar13;
      for (pSVar14 = this; pSVar12 = pSVar19 + 1, pSVar14 != pSVar18; pSVar14 = pSVar14 + 1) {
        *pSVar19 = *pSVar14;
        pSVar19 = pSVar12;
      }
      std::
      _Vector_base<(anonymous_namespace)::DisjointSet::Set,_std::allocator<(anonymous_namespace)::DisjointSet::Set>_>
      ::_M_deallocate((_Vector_base<(anonymous_namespace)::DisjointSet::Set,_std::allocator<(anonymous_namespace)::DisjointSet::Set>_>
                       *)this,pSVar23,__n_00);
      pSVar18 = pSVar13 + (long)this_00;
      S.S.
      super__Vector_base<(anonymous_namespace)::DisjointSet::Set,_std::allocator<(anonymous_namespace)::DisjointSet::Set>_>
      ._M_impl.super__Vector_impl_data._M_finish = pSVar12;
      S.S.
      super__Vector_base<(anonymous_namespace)::DisjointSet::Set,_std::allocator<(anonymous_namespace)::DisjointSet::Set>_>
      ._M_impl.super__Vector_impl_data._M_start = pSVar13;
      S.S.
      super__Vector_base<(anonymous_namespace)::DisjointSet::Set,_std::allocator<(anonymous_namespace)::DisjointSet::Set>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pSVar18;
    }
    else {
      pSVar12->parent = uVar11;
      pSVar12->rank = 0;
      pSVar12 = pSVar12 + 1;
      S.S.
      super__Vector_base<(anonymous_namespace)::DisjointSet::Set,_std::allocator<(anonymous_namespace)::DisjointSet::Set>_>
      ._M_impl.super__Vector_impl_data._M_finish = pSVar12;
      pSVar23 = pSVar19;
      pSVar13 = this;
    }
    pSVar19 = pSVar23;
    this = pSVar13;
  }
  pcVar9 = V.
           super__Vector_base<signed_char,_boost::alignment::aligned_allocator<signed_char,_32UL>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar8 = S.trees;
LAB_00111542:
  if ((pointer)(uVar22 & 0xffffffff) <= pSVar14) {
    printf("Day 25 Part 1: %u\n",(ulong)uVar8);
    std::
    vector<(anonymous_namespace)::DisjointSet::Set,_std::allocator<(anonymous_namespace)::DisjointSet::Set>_>
    ::~vector(&S.S);
    free(V.super__Vector_base<signed_char,_boost::alignment::aligned_allocator<signed_char,_32UL>_>.
         _M_impl.super__Vector_impl_data._M_start);
    return;
  }
  uVar16 = 0;
  uVar1 = *(undefined4 *)(pcVar9 + (long)pSVar14 * 4);
  do {
    auVar24._4_4_ = uVar1;
    auVar24._0_4_ = uVar1;
    auVar24._8_4_ = uVar1;
    auVar24._12_4_ = uVar1;
    auVar24._16_4_ = uVar1;
    auVar24._20_4_ = uVar1;
    auVar24._24_4_ = uVar1;
    auVar24._28_4_ = uVar1;
    auVar25._8_4_ = 0x3ffffff;
    auVar25._0_8_ = 0x3ffffff03ffffff;
    auVar25._12_4_ = 0x3ffffff;
    auVar25._16_4_ = 0x3ffffff;
    auVar25._20_4_ = 0x3ffffff;
    auVar25._24_4_ = 0x3ffffff;
    auVar25._28_4_ = 0x3ffffff;
    auVar24 = vpsubb_avx2(auVar24,*(undefined1 (*) [32])(pcVar9 + uVar16 * 0x20));
    auVar24 = vpabsb_avx2(auVar24);
    auVar6._8_4_ = 0x1010101;
    auVar6._0_8_ = 0x101010101010101;
    auVar6._12_4_ = 0x1010101;
    auVar6._16_4_ = 0x1010101;
    auVar6._20_4_ = 0x1010101;
    auVar6._24_4_ = 0x1010101;
    auVar6._28_4_ = 0x1010101;
    auVar24 = vpmulld_avx512vl(auVar24,auVar6);
    auVar24 = vpcmpgtd_avx2(auVar24,auVar25);
    uVar20 = ((uint)(SUB321(auVar24 >> 7,0) & 1) | (uint)(SUB321(auVar24 >> 0xf,0) & 1) << 1 |
              (uint)(SUB321(auVar24 >> 0x17,0) & 1) << 2 |
              (uint)(SUB321(auVar24 >> 0x1f,0) & 1) << 3 |
              (uint)(SUB321(auVar24 >> 0x27,0) & 1) << 4 |
              (uint)(SUB321(auVar24 >> 0x2f,0) & 1) << 5 |
              (uint)(SUB321(auVar24 >> 0x37,0) & 1) << 6 |
              (uint)(SUB321(auVar24 >> 0x3f,0) & 1) << 7 |
              (uint)(SUB321(auVar24 >> 0x47,0) & 1) << 8 |
              (uint)(SUB321(auVar24 >> 0x4f,0) & 1) << 9 |
              (uint)(SUB321(auVar24 >> 0x57,0) & 1) << 10 |
              (uint)(SUB321(auVar24 >> 0x5f,0) & 1) << 0xb |
              (uint)(SUB321(auVar24 >> 0x67,0) & 1) << 0xc |
              (uint)(SUB321(auVar24 >> 0x6f,0) & 1) << 0xd |
              (uint)(SUB321(auVar24 >> 0x77,0) & 1) << 0xe | (uint)SUB321(auVar24 >> 0x7f,0) << 0xf
              | (uint)(SUB321(auVar24 >> 0x87,0) & 1) << 0x10 |
              (uint)(SUB321(auVar24 >> 0x8f,0) & 1) << 0x11 |
              (uint)(SUB321(auVar24 >> 0x97,0) & 1) << 0x12 |
              (uint)(SUB321(auVar24 >> 0x9f,0) & 1) << 0x13 |
              (uint)(SUB321(auVar24 >> 0xa7,0) & 1) << 0x14 |
              (uint)(SUB321(auVar24 >> 0xaf,0) & 1) << 0x15 |
              (uint)(SUB321(auVar24 >> 0xb7,0) & 1) << 0x16 |
              (uint)SUB321(auVar24 >> 0xbf,0) << 0x17 | (uint)(SUB321(auVar24 >> 199,0) & 1) << 0x18
              | (uint)(SUB321(auVar24 >> 0xcf,0) & 1) << 0x19 |
              (uint)(SUB321(auVar24 >> 0xd7,0) & 1) << 0x1a |
              (uint)(SUB321(auVar24 >> 0xdf,0) & 1) << 0x1b |
              (uint)(SUB321(auVar24 >> 0xe7,0) & 1) << 0x1c |
              (uint)(SUB321(auVar24 >> 0xef,0) & 1) << 0x1d |
              (uint)(SUB321(auVar24 >> 0xf7,0) & 1) << 0x1e |
             (uint)(byte)(auVar24[0x1f] >> 7) << 0x1f) ^ 0xffffffff;
    if (uVar20 != 0) {
      uVar20 = uVar20 & 0x11111111;
      do {
        uVar17 = 0;
        for (uVar5 = uVar20; (uVar5 & 1) == 0; uVar5 = uVar5 >> 1 | 0x80000000) {
          uVar17 = uVar17 + 1;
        }
        uVar17 = (uVar17 >> 2) + (int)uVar16 * 8;
        if (pSVar14 == (pointer)(ulong)uVar17) {
          pSVar14 = (pointer)((long)&pSVar14->parent + 1);
          goto LAB_00111542;
        }
        uVar10 = anon_unknown.dwarf_ac94f::DisjointSet::find(&S,(uint16_t)pSVar14);
        uVar11 = anon_unknown.dwarf_ac94f::DisjointSet::find(&S,(uint16_t)uVar17);
        if (uVar10 != uVar11) {
          S.trees = uVar8 - 1;
          uVar3 = pSVar23[uVar10].rank;
          uVar4 = pSVar23[uVar11].rank;
          uVar8 = S.trees;
          if (uVar3 < uVar4) {
            pSVar23[uVar10].parent = uVar11;
          }
          else {
            pSVar23[uVar11].parent = uVar10;
            if (uVar3 == uVar4) {
              pSVar23[uVar10].rank = uVar3 + 1;
            }
          }
        }
        uVar20 = uVar20 - 1 & uVar20;
      } while (uVar20 != 0);
    }
    uVar16 = (ulong)((int)uVar16 + 1);
  } while( true );
}

Assistant:

void day25(input_t input) {
	std::vector<int8_t, aligned_allocator<int8_t, alignof(__m256i)>> V;
	V.reserve(8192);

	for (uint8_t n = 0; input.len--; input.s++) {
		uint8_t c = *input.s - '0';
		if (c < 10) {
			V.push_back(n ? -c : c);
			n = 0;
		} else if (*input.s == '-') {
			n = 1;
		}
	}

	uint32_t n_points = V.size() / 4;

	// Pad to nearest multiple of AVX2 vector size
	V.resize((V.size() + 31ULL) & ~31ULL);
	uint32_t n_vectors = V.size() / 32;

	DisjointSet S(n_points);

	auto p32  = (uint32_t *) &V[0];
	auto p256 = (__m256i  *) &V[0];

	// Pairwise measure distance between points
	for (uint32_t i = 1; i < n_points; i++) {
		__m256i v = _mm256_set1_epi32(p32[i]);

		// Compare this point against 8 points at a time
		for (uint32_t j = 0; ; j++) {
			// Absolute difference per coordinate
			__m256i d = _mm256_abs_epi8(_mm256_sub_epi8(v, p256[j]));
			// Horizontal sum of differences per point
			d = _mm256_add_epi32(d, _mm256_slli_epi32(d, 16));
			d = _mm256_add_epi32(d, _mm256_slli_epi32(d,  8));
			// Less than 4?
			d = _mm256_cmpgt_epi32(_mm256_set1_epi32(0x04000000), d);

			uint32_t m = _mm256_movemask_epi8(d);
			if (m) {
				m &= 0x11111111;
				uint32_t base = j * 8;
				do {
					uint32_t idx = base + _tzcnt_u32(m) / 4;
					if (idx == i) {
						goto next_point;
					}
					S.join(i, idx);
					m = _blsr_u32(m);
				} while (m);
			}
		}
next_point:;
	}
	printf("Day 25 Part 1: %u\n", S.trees);
}